

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O2

void EMIT_OP_RPTR_REG(CodeGenGenericContext *ctx,x86Command op,x86Size size,x86Reg index,
                     int multiplier,x86Reg base,uint shift,x86Reg reg2)

{
  x86Instruction *pxVar1;
  x86Argument arg_00;
  x86Argument arg_01;
  x86Reg xVar2;
  ulong uVar3;
  ulong uVar4;
  x86Reg xVar5;
  x86Reg base_local;
  int multiplier_local;
  x86Reg index_local;
  ulong local_80;
  int local_78;
  uint local_74;
  x86Argument arg;
  x86Argument local_50;
  
  uVar4 = (ulong)reg2;
  base_local = base;
  multiplier_local = multiplier;
  index_local = index;
  CodeGenGenericContext::RedirectAddressComputation
            (ctx,&index_local,&multiplier_local,&base_local,&shift);
  xVar5 = index_local;
  xVar2 = base_local;
  if (ctx->genReg[uVar4].type == argReg) {
    uVar4 = (ulong)ctx->genReg[uVar4].field_1.reg;
  }
  if (size == sDWORD) {
    if (ctx->genReg[uVar4].type == argNumber) {
      EMIT_OP_RPTR_NUM(ctx,op,sDWORD,index_local,multiplier_local,base_local,shift,
                       ctx->genReg[uVar4].field_1.labelID);
      return;
    }
  }
  ctx->genRegRead[base_local] = true;
  local_80 = (ulong)index_local;
  ctx->genRegRead[local_80] = true;
  ctx->genRegRead[uVar4] = true;
  arg.type = argPtr;
  arg.ptrBase = base_local;
  arg.ptrIndex = index_local;
  arg.ptrMult = multiplier_local;
  arg.ptrNum = shift;
  uVar3 = (ulong)(op - o_add);
  local_74 = shift;
  local_78 = multiplier_local;
  arg.field_1.ptrSize = size;
  if (op - o_add < 0x3d) {
    if ((0xe0c000000001c0fU >> (uVar3 & 0x3f) & 1) != 0) {
      CodeGenGenericContext::MemRead(ctx,&arg);
      arg_00.ptrIndex = arg.ptrIndex;
      arg_00.ptrBase = arg.ptrBase;
      arg_00.ptrNum = arg.ptrNum;
      arg_00.ptrMult = arg.ptrMult;
      arg_00._4_4_ = arg._4_4_;
      arg_00.type = arg.type;
      arg_00.field_1.reg = arg.field_1.reg;
      arg_00.field_1.imm64Arg._4_4_ = arg.field_1.imm64Arg._4_4_;
      CodeGenGenericContext::InvalidateAddressValue(ctx,arg_00);
      local_50.type = argNone;
      local_50.field_1.imm64Arg = 0;
      local_50.ptrBase = rNONE;
      local_50.ptrIndex = rNONE;
      local_50.ptrMult = 0;
      local_50.ptrNum = 0;
      xVar5 = (x86Reg)local_80;
      CodeGenGenericContext::MemWrite(ctx,&arg,&local_50);
      goto LAB_001ba08d;
    }
    if ((0x1000000000002000U >> (uVar3 & 0x3f) & 1) != 0) {
      CodeGenGenericContext::MemRead(ctx,&arg);
      goto LAB_001ba08d;
    }
    if (uVar3 != 0x30) goto LAB_001ba0fc;
  }
  else {
LAB_001ba0fc:
    if (op != o_mov) {
      __assert_fail("!\"unknown instruction\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                    ,0x71f,
                    "void EMIT_OP_RPTR_REG(CodeGenGenericContext &, x86Command, x86Size, x86Reg, int, x86Reg, unsigned int, x86Reg)"
                   );
    }
  }
  local_80 = (ulong)op;
  if (base_local == rESP) {
    __assert_fail("base != rESP",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                  ,0x6ff,
                  "void EMIT_OP_RPTR_REG(CodeGenGenericContext &, x86Command, x86Size, x86Reg, int, x86Reg, unsigned int, x86Reg)"
                 );
  }
  arg_01.ptrIndex = index_local;
  arg_01.ptrBase = base_local;
  arg_01.ptrNum = shift;
  arg_01.ptrMult = multiplier_local;
  arg_01._4_4_ = arg._4_4_;
  arg_01.type = 4;
  arg_01.field_1.ptrSize = size;
  arg_01.field_1.imm64Arg._4_4_ = arg.field_1.imm64Arg._4_4_;
  CodeGenGenericContext::InvalidateAddressValue(ctx,arg_01);
  CodeGenGenericContext::MemKillDeadStore(ctx,&arg);
  local_50.type = argReg;
  local_50.field_1.reg = (x86Reg)uVar4;
  local_50.ptrBase = rNONE;
  local_50.ptrIndex = rNONE;
  local_50.ptrMult = 0;
  local_50.ptrNum = 0;
  CodeGenGenericContext::MemWrite(ctx,&arg,&local_50);
  op = (x86Command)local_80;
LAB_001ba08d:
  pxVar1 = ctx->x86Op;
  pxVar1->name = op;
  (pxVar1->argA).type = argPtr;
  (pxVar1->argA).field_1.ptrSize = size;
  pxVar1 = ctx->x86Op;
  (pxVar1->argA).ptrIndex = xVar5;
  (pxVar1->argA).ptrMult = local_78;
  (pxVar1->argA).ptrBase = xVar2;
  (pxVar1->argA).ptrNum = local_74;
  (pxVar1->argB).type = argReg;
  (pxVar1->argB).field_1.reg = (x86Reg)uVar4;
  ctx->x86Op = ctx->x86Op + 1;
  return;
}

Assistant:

void EMIT_OP_RPTR_REG(CodeGenGenericContext &ctx, x86Command op, x86Size size, x86Reg index, int multiplier, x86Reg base, unsigned shift, x86Reg reg2)
{
#ifdef NULLC_OPTIMIZE_X86
	ctx.RedirectAddressComputation(index, multiplier, base, shift);

	x86Reg redirect = ctx.RedirectRegister(reg2);

	// On x86 it is impossible to move extra registers into a byte of memory, so some redirections are ignored
	if(sizeof(void*) == 4 && size == sBYTE)
	{
		if(redirect <= rEDX)
			reg2 = redirect;
	}
	else
	{
		reg2 = redirect;
	}

	if(size == sDWORD && ctx.genReg[reg2].type == x86Argument::argNumber)
	{
		EMIT_OP_RPTR_NUM(ctx, op, size, index, multiplier, base, shift, ctx.genReg[reg2].num);
		return;
	}

	// Register reads
	ctx.ReadRegister(base);
	ctx.ReadRegister(index);
	ctx.ReadRegister(reg2);

	x86Argument arg = x86Argument(size, index, multiplier, base, shift);

	switch(op)
	{
	case o_mov:
	case o_mov64:
		assert(base != rESP);

		ctx.InvalidateAddressValue(arg);

		ctx.MemKillDeadStore(arg);

		// Track target memory value
		ctx.MemWrite(arg, x86Argument(reg2));
		break;
	case o_add:
	case o_sub:
	case o_adc:
	case o_sbb:
	case o_and:
	case o_or:
	case o_xor:
	case o_add64:
	case o_sub64:
	case o_and64:
	case o_or64:
	case o_xor64:
		ctx.MemRead(arg);

		ctx.InvalidateAddressValue(arg);
		
		ctx.MemWrite(arg, x86Argument());
		break;
	case o_cmp:
	case o_cmp64:
		ctx.MemRead(arg);
		break;
	default:
		assert(!"unknown instruction");
	}
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argPtr;
	ctx.x86Op->argA.ptrSize = size;
	ctx.x86Op->argA.ptrIndex = index;
	ctx.x86Op->argA.ptrMult = multiplier;
	ctx.x86Op->argA.ptrBase = base;
	ctx.x86Op->argA.ptrNum = shift;
	ctx.x86Op->argB.type = x86Argument::argReg;
	ctx.x86Op->argB.reg = reg2;
	ctx.x86Op++;
}